

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O3

int erkStep_FullRHS(ARKodeMem ark_mem,sunrealtype t,N_Vector y,N_Vector f,int mode)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  puVar1 = (undefined8 *)ark_mem->step_mem;
  if (puVar1 == (undefined8 *)0x0) {
    msgfmt = "Time step module memory is NULL.";
    iVar3 = -0x15;
    error_code = -0x15;
    iVar2 = 0x309;
LAB_00131b0b:
    arkProcessError(ark_mem,error_code,iVar2,"erkStep_FullRHS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                    ,msgfmt);
  }
  else {
    if (mode == 2) {
      iVar2 = (*(code *)*puVar1)(y,f,ark_mem->user_data);
      puVar1[5] = puVar1[5] + 1;
      if (iVar2 != 0) {
        iVar2 = 0x23e;
LAB_00131ad8:
        arkProcessError(ark_mem,-8,iVar2,"erkStep_FullRHS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                        ,
                        "At t = %lg, the right-hand side routine failed in an unrecoverable manner."
                        ,t);
        return -8;
      }
    }
    else {
      if (mode == 1) {
        if (ark_mem->fn_is_current == 0) {
          iVar2 = ARKodeButcherTable_IsStifflyAccurate((ARKodeButcherTable)puVar1[4]);
          if ((ark_mem->relax_enabled == 0) && (iVar2 != 0)) {
            N_VScale(0x3ff0000000000000,((undefined8 *)puVar1[1])[(long)*(int *)(puVar1 + 3) + -1],
                     *(undefined8 *)puVar1[1]);
          }
          else {
            iVar2 = (*(code *)*puVar1)(t,y,*(undefined8 *)puVar1[1],ark_mem->user_data);
            puVar1[5] = puVar1[5] + 1;
            if (iVar2 != 0) {
              iVar2 = 0x22a;
              goto LAB_00131ad8;
            }
          }
        }
      }
      else {
        if (mode != 0) {
          msgfmt = "Unknown full RHS mode";
          iVar3 = -8;
          error_code = -8;
          iVar2 = 0x247;
          goto LAB_00131b0b;
        }
        if (ark_mem->fn_is_current == 0) {
          iVar2 = (*(code *)*puVar1)(t,y,*(undefined8 *)puVar1[1],ark_mem->user_data);
          puVar1[5] = puVar1[5] + 1;
          if (iVar2 != 0) {
            iVar2 = 0x20d;
            goto LAB_00131ad8;
          }
        }
      }
      N_VScale(0x3ff0000000000000,*(undefined8 *)puVar1[1],f);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int erkStep_FullRHS(ARKodeMem ark_mem, sunrealtype t, N_Vector y, N_Vector f,
                    int mode)
{
  int retval;
  ARKodeERKStepMem step_mem;
  sunbooleantype recomputeRHS;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* perform RHS functions contingent on 'mode' argument */
  switch (mode)
  {
  case ARK_FULLRHS_START:

    /* compute the RHS */
    if (!(ark_mem->fn_is_current))
    {
      retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
      step_mem->nfe++;
      if (retval != 0)
      {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                        MSG_ARK_RHSFUNC_FAILED, t);
        return (ARK_RHSFUNC_FAIL);
      }
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  case ARK_FULLRHS_END:

    /* determine if RHS function needs to be recomputed */
    if (!(ark_mem->fn_is_current))
    {
      recomputeRHS = !ARKodeButcherTable_IsStifflyAccurate(step_mem->B);

      /* First Same As Last methods are not FSAL when relaxation is enabled */
      if (ark_mem->relax_enabled) { recomputeRHS = SUNTRUE; }

      /* base RHS calls on recomputeRHS argument */
      if (recomputeRHS)
      {
        /* call f */
        retval = step_mem->f(t, y, step_mem->F[0], ark_mem->user_data);
        step_mem->nfe++;
        if (retval != 0)
        {
          arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__,
                          __FILE__, MSG_ARK_RHSFUNC_FAILED, t);
          return (ARK_RHSFUNC_FAIL);
        }
      }
      else { N_VScale(ONE, step_mem->F[step_mem->stages - 1], step_mem->F[0]); }
    }

    /* copy RHS vector into output */
    N_VScale(ONE, step_mem->F[0], f);

    break;

  case ARK_FULLRHS_OTHER:

    /* call f */
    retval = step_mem->f(t, y, f, ark_mem->user_data);
    step_mem->nfe++;
    if (retval != 0)
    {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_RHSFUNC_FAILED, t);
      return (ARK_RHSFUNC_FAIL);
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    "Unknown full RHS mode");
    return (ARK_RHSFUNC_FAIL);
  }

  return (ARK_SUCCESS);
}